

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_iload_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::getLocalVariableValue(this_01,0);
  if (operand.type == INT) {
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x28b,"void ExecutionEngine::i_iload_0()");
}

Assistant:

void ExecutionEngine::i_iload_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->getLocalVariableValue(0);
    assert(value.type == ValueType::INT);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}